

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsLayoutPrivate::getMargin
          (QGraphicsLayoutPrivate *this,qreal *result,qreal userMargin,PixelMetric pm)

{
  bool bVar1;
  int iVar2;
  QGraphicsLayoutItem *pQVar3;
  QGraphicsWidget *this_00;
  QStyle *pQVar4;
  undefined4 in_EDX;
  double *in_RSI;
  QGraphicsLayoutPrivate *in_RDI;
  double in_XMM0_Qa;
  QGraphicsItem *layoutParentItem;
  QGraphicsLayoutItem *parent;
  QGraphicsLayout *q;
  
  if (in_RSI != (double *)0x0) {
    q_func(in_RDI);
    pQVar3 = QGraphicsLayoutItem::parentLayoutItem((QGraphicsLayoutItem *)0x9b37dc);
    if (in_XMM0_Qa < 0.0) {
      if (pQVar3 == (QGraphicsLayoutItem *)0x0) {
        *in_RSI = 0.0;
      }
      else {
        bVar1 = QGraphicsLayoutItem::isLayout((QGraphicsLayoutItem *)0x9b3827);
        if (bVar1) {
          *in_RSI = 0.0;
        }
        else {
          *in_RSI = 0.0;
          this_00 = (QGraphicsWidget *)
                    QGraphicsLayoutItemPrivate::parentItem
                              (&in_RDI->super_QGraphicsLayoutItemPrivate);
          if ((this_00 != (QGraphicsWidget *)0x0) &&
             (bVar1 = QGraphicsItem::isWidget((QGraphicsItem *)0x9b386b), bVar1)) {
            pQVar4 = QGraphicsWidget::style(this_00);
            iVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,in_EDX,0);
            *in_RSI = (double)iVar2;
          }
        }
      }
    }
    else {
      *in_RSI = in_XMM0_Qa;
    }
  }
  return;
}

Assistant:

void QGraphicsLayoutPrivate::getMargin(qreal *result, qreal userMargin, QStyle::PixelMetric pm) const
{
    if (!result)
        return;
    Q_Q(const QGraphicsLayout);

    QGraphicsLayoutItem *parent = q->parentLayoutItem();
    if (userMargin >= 0.0) {
        *result = userMargin;
    } else if (!parent) {
        *result = 0.0;
    } else if (parent->isLayout()) {    // sublayouts have 0 margin by default
        *result = 0.0;
    } else {
        *result = 0.0;
        if (QGraphicsItem *layoutParentItem = parentItem()) {
            if (layoutParentItem->isWidget())
                *result = (qreal)static_cast<QGraphicsWidget*>(layoutParentItem)->style()->pixelMetric(pm, nullptr);
        }
    }
}